

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O0

Subject * GetRandom<Subject>(vector<Subject,_std::allocator<Subject>_> *vec)

{
  result_type_conflict1 rVar1;
  size_type sVar2;
  mt19937 *__urng;
  const_reference pvVar3;
  size_t randomPos;
  uniform_int_distribution<int> distribution;
  vector<Subject,_std::allocator<Subject>_> *vec_local;
  
  distribution._M_param = (param_type)vec;
  sVar2 = std::vector<Subject,_std::allocator<Subject>_>::size(vec);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&randomPos,0,(int)sVar2 + -1);
  __urng = random_engine();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&randomPos,__urng);
  pvVar3 = std::vector<Subject,_std::allocator<Subject>_>::operator[]
                     ((vector<Subject,_std::allocator<Subject>_> *)distribution._M_param,(long)rVar1
                     );
  return pvVar3;
}

Assistant:

static const T& GetRandom(const vector<T>& vec) {
    uniform_int_distribution<int> distribution(0, vec.size() - 1);
    size_t randomPos = distribution(random_engine());
    return vec[randomPos];
}